

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O2

void __thiscall
btDbvtBroadphase::performDeferredRemoval(btDbvtBroadphase *this,btDispatcher *dispatcher)

{
  btBroadphasePair *pbVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  btAlignedObjectArray<btBroadphasePair> *this_00;
  long lVar6;
  long lVar7;
  long lVar8;
  btDbvtProxy *pb;
  undefined8 *puVar9;
  long lVar10;
  btDbvtProxy *pa;
  int local_6c;
  btBroadphasePair local_58;
  undefined4 extraout_var;
  
  iVar5 = (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
            [0xe])();
  if ((char)iVar5 != '\0') {
    iVar5 = (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
              [7])();
    this_00 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var,iVar5);
    btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
              (this_00,(btBroadphasePairSortPredicate *)&local_58);
    lVar10 = 0;
    local_6c = 0;
    lVar6 = 0;
    lVar7 = 0;
    for (lVar8 = 0; lVar8 < this_00->m_size; lVar8 = lVar8 + 1) {
      pbVar1 = this_00->m_data;
      lVar2 = *(long *)((long)&pbVar1->m_pProxy0 + lVar10);
      lVar3 = *(long *)((long)&pbVar1->m_pProxy1 + lVar10);
      if (lVar7 == lVar3 && lVar6 == lVar2) {
LAB_001308ba:
        puVar9 = (undefined8 *)((long)&pbVar1->m_pProxy0 + lVar10);
        (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[8])
                  (this->m_paircache,puVar9,dispatcher);
        local_6c = local_6c + 1;
        *puVar9 = 0;
        puVar9[1] = 0;
      }
      else {
        bVar4 = Intersect(*(btDbvtAabbMm **)(lVar2 + 0x40),*(btDbvtAabbMm **)(lVar3 + 0x40));
        if (!bVar4) goto LAB_001308ba;
      }
      lVar10 = lVar10 + 0x20;
      lVar6 = lVar2;
      lVar7 = lVar3;
    }
    btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
              (this_00,(btBroadphasePairSortPredicate *)&local_58);
    local_58.m_algorithm = (btCollisionAlgorithm *)0x0;
    local_58.field_3.m_internalInfo1 = (void *)0x0;
    local_58.m_pProxy0 = (btBroadphaseProxy *)0x0;
    local_58.m_pProxy1 = (btBroadphaseProxy *)0x0;
    btAlignedObjectArray<btBroadphasePair>::resize(this_00,this_00->m_size - local_6c,&local_58);
  }
  return;
}

Assistant:

void btDbvtBroadphase::performDeferredRemoval(btDispatcher* dispatcher)
{

	if (m_paircache->hasDeferredRemoval())
	{

		btBroadphasePairArray&	overlappingPairArray = m_paircache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		int invalidPair = 0;

		
		int i;

		btBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;
		
		
		for (i=0;i<overlappingPairArray.size();i++)
		{
		
			btBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				//important to perform AABB check that is consistent with the broadphase
				btDbvtProxy*		pa=(btDbvtProxy*)pair.m_pProxy0;
				btDbvtProxy*		pb=(btDbvtProxy*)pair.m_pProxy1;
				bool hasOverlap = Intersect(pa->leaf->volume,pb->leaf->volume);

				if (hasOverlap)
				{
					needsRemoval = false;
				} else
				{
					needsRemoval = true;
				}
			} else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				btAssert(!pair.m_algorithm);
			}
			
			if (needsRemoval)
			{
				m_paircache->cleanOverlappingPair(pair,dispatcher);

				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				invalidPair++;
			} 
			
		}

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());
		overlappingPairArray.resize(overlappingPairArray.size() - invalidPair);
	}
}